

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvodePreconditioner.cpp
# Opt level: O1

int pele::physics::reactions::cvode::PSolve
              (Real param_1,N_Vector param_2,N_Vector param_3,N_Vector r,N_Vector z,Real param_6,
              Real param_7,int param_8,void *user_data)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  realtype *b;
  
  b = N_VGetArrayPointer(z);
  puVar1 = *(undefined8 **)((long)user_data + 0xb0);
  puVar2 = *(undefined8 **)((long)user_data + 0xb8);
  N_VScale(1.0,r,z);
  SUNDlsMat_denseGETRS(*(realtype ***)*puVar1,10,*(sunindextype **)*puVar2,b);
  return 0;
}

Assistant:

int
PSolve(
  amrex::Real /* tn */,
  N_Vector /* u */,
  N_Vector /* fu */,
  N_Vector r,
  N_Vector z,
  amrex::Real /* gamma */,
  amrex::Real /* delta */,
  int /* lr */,
  void* user_data)
{
  BL_PROFILE("Pele::ReactorCvode::PSolve()");
  // Make local copies of pointers to input data
  amrex::Real* zdata = N_VGetArrayPointer(z);

  // Extract the P and pivot arrays from user_data.
  auto* udata = static_cast<CVODEUserData*>(user_data);
  auto* P = udata->P;
  auto* pivot = udata->pivot;

  N_VScale(1.0, r, z);

  // Solve the block-diagonal system Pz = r using LU factors stored
  //   in P and pivot data in pivot, and return the solution in z.
  amrex::Real* v = zdata;
  SUNDlsMat_denseGETRS(P[0][0], NUM_SPECIES + 1, pivot[0][0], v);

  return (0);
}